

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operand.h
# Opt level: O2

error __thiscall b2r::result(b2r *this,context *ctx,token *token,opcode *op)

{
  int iVar1;
  token local_50;
  
  iVar1 = equal(token,".RESULT");
  if (iVar1 == 0) {
    fail((token *)this,(char *)token,"expected .RESULT");
  }
  else {
    context::tokenize(&local_50,ctx);
    token->column = local_50.column;
    (token->data).string._M_str = local_50.data.string._M_str;
    token->type = local_50.type;
    token->line = local_50.line;
    token->filename = local_50.filename;
    (token->data).predicate = local_50.data.predicate;
    opcode::add_bits(op,0xd00000000);
    opcode::add_bits(op,0xff00);
    *(undefined8 *)this = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)this;
}

Assistant:

DEFINE_OPERAND(result)
    {
        if (!equal(token, ".RESULT")) {
            return fail(token, "expected .RESULT");
        }
        token = ctx.tokenize();
        op.add_bits(0xDULL << 32);
        op.add_bits(0xFFULL << 8);
        return {};
    }